

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

int genPiecesRecusively(piecefunc_t *gen,PieceEnv *env,Piece *current,int depth)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int in_ECX;
  long in_RDX;
  long *in_RSI;
  code *in_RDI;
  Piece *q;
  Piece *p;
  int gendepth;
  PieceEnv env_local;
  int n_local;
  int j;
  int i;
  long local_98;
  int *local_90;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  long local_20;
  long *local_18;
  code *local_10;
  int local_4;
  
  if (in_ECX < 9) {
    local_30 = 0;
    local_24 = in_ECX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    memcpy(&local_98,in_RSI,0x68);
    local_98 = *local_18 + (long)*(int *)local_18[1] * 0x38;
    local_90 = &local_30;
    iVar1 = (*local_10)(&local_98,local_20,local_24);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      iVar1 = next((uint64_t *)local_18[2],0x20);
      for (local_28 = 0; local_28 < local_30; local_28 = local_28 + 1) {
        lVar2 = local_98 + (long)local_28 * 0x38;
        *(char *)(lVar2 + 0x2d) = (char)iVar1;
        for (local_2c = 0; local_2c < *(int *)local_18[1]; local_2c = local_2c + 1) {
          lVar3 = *local_18 + (long)local_2c * 0x38;
          if ((((*(int *)(lVar2 + 0x14) <= *(int *)(lVar3 + 0x20)) &&
               (*(int *)(lVar3 + 0x14) <= *(int *)(lVar2 + 0x20))) &&
              (*(int *)(lVar2 + 0x1c) <= *(int *)(lVar3 + 0x28))) &&
             (((*(int *)(lVar3 + 0x1c) <= *(int *)(lVar2 + 0x28) &&
               (*(int *)(lVar2 + 0x18) <= *(int *)(lVar3 + 0x24))) &&
              (*(int *)(lVar3 + 0x18) <= *(int *)(lVar2 + 0x24))))) {
            if (*(char *)(local_20 + 0x2d) != *(char *)(lVar3 + 0x2d)) {
              return 0;
            }
            break;
          }
        }
      }
      *(int *)local_18[1] = local_30 + *(int *)local_18[1];
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static
int genPiecesRecusively(piecefunc_t gen, PieceEnv *env, Piece *current, int depth)
{
    if (depth > 8)
        return 0;
    int i, j, n_local = 0;
    PieceEnv env_local = *env;
    env_local.list = env->list + *env->n;
    env_local.n = &n_local;
    if (!gen(&env_local, current, depth))
        return 0;
    int gendepth = next(env->rng, 32);
    for (i = 0; i < n_local; i++)
    {
        Piece *p = env_local.list + i;
        p->depth = gendepth;
        for (j = 0; j < *env->n; j++)
        {   // check for piece with bounding box collition
            Piece *q = env->list + j;
            if (q->bb1.x >= p->bb0.x && q->bb0.x <= p->bb1.x &&
                q->bb1.z >= p->bb0.z && q->bb0.z <= p->bb1.z &&
                q->bb1.y >= p->bb0.y && q->bb0.y <= p->bb1.y)
            {
                if (current->depth != q->depth)
                    return 0;
                break;
            }
        }
    }
    (*env->n) += n_local;
    return 1;
}